

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mif_cod.c
# Opt level: O0

int mif_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  undefined8 uVar1;
  int fmt_00;
  int iVar2;
  jas_seqent_t *pjVar3;
  long lStack_98;
  int bias;
  int_fast32_t y;
  int_fast32_t x;
  jas_seq2d_t *data;
  jas_image_cmptparm_t cmptparm;
  mif_cmpt_t *cmpt;
  int cmptno;
  int fmt;
  jas_image_t *tmpimage;
  mif_hdr_t *hdr;
  char *optstr_local;
  jas_stream_t *out_local;
  jas_image_t *image_local;
  
  tmpimage = (jas_image_t *)0x0;
  _cmptno = (jas_image_t *)0x0;
  x = 0;
  if ((optstr != (char *)0x0) && (*optstr != '\0')) {
    jas_eprintf("warning: ignoring unsupported options\n");
  }
  fmt_00 = jas_image_strtofmt("pnm");
  if (fmt_00 < 0) {
    jas_eprintf("error: PNM support required\n");
  }
  else {
    tmpimage = (jas_image_t *)mif_makehdrfromimage(image);
    if ((tmpimage != (jas_image_t *)0x0) &&
       (iVar2 = mif_hdr_put((mif_hdr_t *)tmpimage,out), iVar2 == 0)) {
      cmpt._0_4_ = 0;
      do {
        x = 0;
        if ((int)tmpimage->tly_ <= (int)(uint)cmpt) {
          mif_hdr_destroy((mif_hdr_t *)tmpimage);
          return 0;
        }
        cmptparm._48_8_ = ((mif_cmpt_t **)tmpimage->brx_)[(int)(uint)cmpt];
        if (((mif_cmpt_t *)cmptparm._48_8_)->data == (char *)0x0) {
          _cmptno = jas_image_create0();
          if (_cmptno == (jas_image_t *)0x0) break;
          data = (jas_seq2d_t *)0x0;
          cmptparm.tlx = 0;
          cmptparm.tly = *(jas_image_coord_t *)(cmptparm._48_8_ + 0x20);
          cmptparm.hstep = *(jas_image_coord_t *)(cmptparm._48_8_ + 0x28);
          cmptparm.vstep = *(jas_image_coord_t *)(cmptparm._48_8_ + 0x10);
          cmptparm.width = *(jas_image_coord_t *)(cmptparm._48_8_ + 0x18);
          cmptparm.height._0_4_ = (undefined4)*(undefined8 *)(cmptparm._48_8_ + 0x30);
          cmptparm.height._4_4_ = 0;
          iVar2 = jas_image_addcmpt(_cmptno,_cmptno->numcmpts_,(jas_image_cmptparm_t *)&data);
          if (iVar2 != 0) break;
          _cmptno->clrspc_ = 0x301;
          (*_cmptno->cmpts_)->type_ = 0;
          x = (int_fast32_t)
              jas_seq2d_create(0,0,*(jas_matind_t *)(cmptparm._48_8_ + 0x10),
                               *(jas_matind_t *)(cmptparm._48_8_ + 0x18));
          if (((jas_matrix_t *)x == (jas_matrix_t *)0x0) ||
             (iVar2 = jas_image_readcmpt(image,(uint)cmpt,0,0,
                                         *(jas_image_coord_t *)(cmptparm._48_8_ + 0x10),
                                         *(jas_image_coord_t *)(cmptparm._48_8_ + 0x18),
                                         (jas_matrix_t *)x), iVar2 != 0)) break;
          if (*(long *)(cmptparm._48_8_ + 0x38) != 0) {
            uVar1 = *(undefined8 *)(cmptparm._48_8_ + 0x30);
            for (lStack_98 = 0; lStack_98 < *(long *)(cmptparm._48_8_ + 0x18);
                lStack_98 = lStack_98 + 1) {
              for (y = 0; y < *(long *)(cmptparm._48_8_ + 0x10); y = y + 1) {
                pjVar3 = jas_seq2d_getref((jas_seq2d_t *)x,y,lStack_98);
                *pjVar3 = (long)(1 << ((char)uVar1 - 1U & 0x1f)) + *pjVar3;
              }
            }
          }
          iVar2 = jas_image_writecmpt(_cmptno,0,0,0,*(jas_image_coord_t *)(cmptparm._48_8_ + 0x10),
                                      *(jas_image_coord_t *)(cmptparm._48_8_ + 0x18),
                                      (jas_matrix_t *)x);
          if (iVar2 != 0) break;
          jas_seq2d_destroy((jas_seq2d_t *)x);
          x = 0;
          iVar2 = jas_image_encode(_cmptno,out,fmt_00,(char *)0x0);
          if (iVar2 != 0) break;
          jas_image_destroy(_cmptno);
        }
        cmpt._0_4_ = (uint)cmpt + 1;
      } while( true );
    }
  }
  if (tmpimage != (jas_image_t *)0x0) {
    mif_hdr_destroy((mif_hdr_t *)tmpimage);
  }
  if (_cmptno != (jas_image_t *)0x0) {
    jas_image_destroy(_cmptno);
  }
  if (x != 0) {
    jas_seq2d_destroy((jas_seq2d_t *)x);
  }
  return -1;
}

Assistant:

int mif_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	mif_hdr_t *hdr;
	jas_image_t *tmpimage;
	int fmt;
	int cmptno;
	mif_cmpt_t *cmpt;
	jas_image_cmptparm_t cmptparm;
	jas_seq2d_t *data;
	int_fast32_t x;
	int_fast32_t y;
	int bias;

	hdr = 0;
	tmpimage = 0;
	data = 0;

	if (optstr && *optstr != '\0') {
		jas_eprintf("warning: ignoring unsupported options\n");
	}

	if ((fmt = jas_image_strtofmt("pnm")) < 0) {
		jas_eprintf("error: PNM support required\n");
		goto error;
	}

	if (!(hdr = mif_makehdrfromimage(image))) {
		goto error;
	}
	if (mif_hdr_put(hdr, out)) {
		goto error;
	}

	/* Output component data. */
	for (cmptno = 0; cmptno < hdr->numcmpts; ++cmptno) {
		cmpt = hdr->cmpts[cmptno];
		if (!cmpt->data) {
			if (!(tmpimage = jas_image_create0())) {
				goto error;
			}	
			cmptparm.tlx = 0;
			cmptparm.tly = 0;
			cmptparm.hstep = cmpt->sampperx;
			cmptparm.vstep = cmpt->samppery;
			cmptparm.width = cmpt->width;
			cmptparm.height = cmpt->height;
			cmptparm.prec = cmpt->prec;
			cmptparm.sgnd = false;
			if (jas_image_addcmpt(tmpimage, jas_image_numcmpts(tmpimage),
			  &cmptparm)) {
				goto error;
			}
			jas_image_setclrspc(tmpimage, JAS_CLRSPC_SGRAY);
			jas_image_setcmpttype(tmpimage, 0,
			  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_GRAY_Y));
			if (!(data = jas_seq2d_create(0, 0, cmpt->width, cmpt->height))) {
				goto error;
			}
			if (jas_image_readcmpt(image, cmptno, 0, 0, cmpt->width,
			  cmpt->height, data)) {
				goto error;
			}
			if (cmpt->sgnd) {
				bias = 1 << (cmpt->prec - 1);
				for (y = 0; y < cmpt->height; ++y) {
					for (x = 0; x < cmpt->width; ++x) {
						*jas_seq2d_getref(data, x, y) += bias;
					}
				}
			}
			if (jas_image_writecmpt(tmpimage, 0, 0, 0, cmpt->width,
			  cmpt->height, data)) {
				goto error;
			}
			jas_seq2d_destroy(data);
			data = 0;
			if (jas_image_encode(tmpimage, out, fmt, 0)) {
				goto error;
			}
			jas_image_destroy(tmpimage);
			tmpimage = 0;
		}
	}

	mif_hdr_destroy(hdr);

	return 0;

error:
	if (hdr) {
		mif_hdr_destroy(hdr);
	}
	if (tmpimage) {
		jas_image_destroy(tmpimage);
	}
	if (data) {
		jas_seq2d_destroy(data);
	}
	return -1;
}